

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScrollerPrivate::setContentPositionHelperScrolling(QScrollerPrivate *this)

{
  qreal *this_00;
  double dVar1;
  double dVar2;
  qint64 now;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  undefined4 local_f8;
  undefined1 local_f4 [16];
  undefined4 local_e4;
  char *local_e0;
  QDebug local_d8;
  QPointF local_d0;
  QPointF local_c0;
  QPointF local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  QPointF local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char *pcStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  now = QElapsedTimer::elapsed();
  dVar1 = (this->contentPosition).yp;
  dVar2 = (this->overshootPosition).yp;
  local_88.xp = nextSegmentPosition(&this->xSegments,now,
                                    (this->contentPosition).xp + (this->overshootPosition).xp);
  local_88.yp = nextSegmentPosition(&this->ySegments,now,dVar1 + dVar2);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    pcStack_60 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<((QDebug *)&local_b0,
                                "QScroller::setContentPositionHelperScrolling()\n  --> overshoot:");
    local_a0._0_8_ = pQVar3->stream;
    *(int *)(local_a0._0_8_ + 0x28) = *(int *)(local_a0._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_f8,(QPointF *)local_a0);
    pQVar3 = QDebug::operator<<((QDebug *)&local_f8,"- new pos:");
    local_a0._8_8_ = pQVar3->stream;
    *(int *)(local_a0._8_8_ + 0x28) = *(int *)(local_a0._8_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_90,(QPointF *)(local_a0 + 8));
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)(local_a0 + 8));
    QDebug::~QDebug((QDebug *)&local_f8);
    QDebug::~QDebug((QDebug *)local_a0);
    QDebug::~QDebug((QDebug *)&local_b0);
  }
  local_b0 = clampToRect(&local_88,&this->contentPosRange);
  (this->overshootPosition).xp = local_88.xp - local_b0.xp;
  (this->overshootPosition).yp = local_88.yp - local_b0.yp;
  this->contentPosition = local_b0;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  uStack_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  pcStack_60 = (char *)0xffffffffffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QScrollEvent::QScrollEvent
            ((QScrollEvent *)&local_78,&this->contentPosition,&this->overshootPosition,
             this->firstScroll ^ ScrollUpdated);
  qt_sendSpontaneousEvent(this->target,(QEvent *)&local_78);
  this->firstScroll = false;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_f8 = 2;
    local_f4 = (undefined1  [16])0x0;
    local_e4 = 0;
    local_e0 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_d8,"  --> new position:");
    local_d0.xp = (qreal)pQVar3->stream;
    *(int *)((long)local_d0.xp + 0x28) = *(int *)((long)local_d0.xp + 0x28) + 1;
    this_00 = &local_d0.yp;
    ::operator<<((QDebug)this_00,&local_d0);
    pQVar3 = QDebug::operator<<((QDebug *)this_00,"- new overshoot:");
    local_c0.xp = (qreal)pQVar3->stream;
    *(int *)((long)local_c0.xp + 0x28) = *(int *)((long)local_c0.xp + 0x28) + 1;
    ::operator<<((QDebug)&local_c0.yp,&local_c0);
    QDebug::~QDebug((QDebug *)&local_c0.yp);
    QDebug::~QDebug((QDebug *)&local_c0);
    QDebug::~QDebug((QDebug *)this_00);
    QDebug::~QDebug((QDebug *)&local_d0);
    QDebug::~QDebug(&local_d8);
  }
  QScrollEvent::~QScrollEvent((QScrollEvent *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::setContentPositionHelperScrolling()
{
    qint64 now = monotonicTimer.elapsed();
    QPointF newPos = contentPosition + overshootPosition;

    newPos.setX(nextSegmentPosition(xSegments, now, newPos.x()));
    newPos.setY(nextSegmentPosition(ySegments, now, newPos.y()));

    // -- set the position and handle overshoot
    qCDebug(lcScroller) << "QScroller::setContentPositionHelperScrolling()\n"
                        "  --> overshoot:" << overshootPosition << "- new pos:" << newPos;

    QPointF newClampedPos = clampToRect(newPos, contentPosRange);

    overshootPosition = newPos - newClampedPos;
    contentPosition = newClampedPos;

    QScrollEvent se(contentPosition, overshootPosition, firstScroll ? QScrollEvent::ScrollStarted
                                                                    : QScrollEvent::ScrollUpdated);
    sendEvent(target, &se);
    firstScroll = false;

    qCDebug(lcScroller) << "  --> new position:" << newClampedPos << "- new overshoot:" << overshootPosition;
}